

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O1

ngx_int_t ngx_inet_resolve_host(ngx_pool_t *pool,ngx_url_t *u)

{
  int iVar1;
  u_char *puVar2;
  addrinfo *paVar3;
  ngx_addr_t *pnVar4;
  sockaddr *psVar5;
  size_t sVar6;
  ngx_uint_t nVar7;
  addrinfo *paVar8;
  long lVar9;
  addrinfo local_88;
  ngx_url_t *local_50;
  ngx_pool_t *local_48;
  addrinfo *local_40;
  addrinfo *res;
  
  res._6_2_ = u->port;
  puVar2 = (u_char *)ngx_alloc((u->host).len + 1,pool->log);
  if (puVar2 != (u_char *)0x0) {
    ngx_cpystrn(puVar2,(u->host).data,(u->host).len + 1);
    local_88.ai_addrlen = 0;
    local_88._20_4_ = 0;
    local_88.ai_addr = (sockaddr *)0x0;
    local_88.ai_canonname = (char *)0x0;
    local_88.ai_next = (addrinfo *)0x0;
    local_88.ai_socktype = 1;
    local_88.ai_protocol = 0;
    local_88.ai_flags = 0x20;
    local_88.ai_family = 0;
    iVar1 = getaddrinfo((char *)puVar2,(char *)0x0,&local_88,&local_40);
    if (iVar1 == 0) {
      free(puVar2);
      nVar7 = 0;
      for (paVar3 = local_40; paVar3 != (addrinfo *)0x0; paVar3 = paVar3->ai_next) {
        if ((paVar3->ai_family | 8U) == 10) {
          nVar7 = nVar7 + 1;
        }
      }
      if (nVar7 == 0) {
        u->err = "host not found";
      }
      else {
        pnVar4 = (ngx_addr_t *)ngx_pcalloc(pool,nVar7 << 5);
        u->addrs = pnVar4;
        if (pnVar4 != (ngx_addr_t *)0x0) {
          res._6_2_ = res._6_2_ << 8 | res._6_2_ >> 8;
          u->naddrs = nVar7;
          local_50 = u;
          local_48 = pool;
          if (local_40 == (addrinfo *)0x0) {
            lVar9 = 0;
            paVar3 = local_40;
          }
          else {
            lVar9 = 0;
            paVar8 = local_40;
            do {
              if (paVar8->ai_family == 2) {
                psVar5 = (sockaddr *)ngx_pcalloc(pool,(ulong)paVar8->ai_addrlen);
                if (psVar5 == (sockaddr *)0x0) goto LAB_0011a049;
                memcpy(psVar5,paVar8->ai_addr,(ulong)paVar8->ai_addrlen);
                *(ushort *)psVar5->sa_data = res._6_2_;
                pnVar4 = local_50->addrs;
                pnVar4[lVar9].sockaddr = psVar5;
                pnVar4[lVar9].socklen = paVar8->ai_addrlen;
                puVar2 = (u_char *)ngx_pnalloc(local_48,0x15);
                if (puVar2 == (u_char *)0x0) goto LAB_0011a049;
                sVar6 = ngx_sock_ntop(psVar5,paVar8->ai_addrlen,puVar2,0x15,1);
                pnVar4 = local_50->addrs;
                pnVar4[lVar9].name.len = sVar6;
                pnVar4[lVar9].name.data = puVar2;
                lVar9 = lVar9 + 1;
                pool = local_48;
              }
              paVar8 = paVar8->ai_next;
              paVar3 = local_40;
            } while (paVar8 != (addrinfo *)0x0);
          }
          do {
            if (paVar3 == (addrinfo *)0x0) {
              freeaddrinfo(local_40);
              return 0;
            }
            if (paVar3->ai_family == 10) {
              psVar5 = (sockaddr *)ngx_pcalloc(pool,(ulong)paVar3->ai_addrlen);
              if (psVar5 == (sockaddr *)0x0) break;
              memcpy(psVar5,paVar3->ai_addr,(ulong)paVar3->ai_addrlen);
              *(ushort *)psVar5->sa_data = res._6_2_;
              pnVar4 = local_50->addrs;
              pnVar4[lVar9].sockaddr = psVar5;
              pnVar4[lVar9].socklen = paVar3->ai_addrlen;
              puVar2 = (u_char *)ngx_pnalloc(local_48,0x35);
              if (puVar2 == (u_char *)0x0) break;
              sVar6 = ngx_sock_ntop(psVar5,paVar3->ai_addrlen,puVar2,0x35,1);
              pnVar4 = local_50->addrs;
              pnVar4[lVar9].name.len = sVar6;
              pnVar4[lVar9].name.data = puVar2;
              lVar9 = lVar9 + 1;
              pool = local_48;
            }
            paVar3 = paVar3->ai_next;
          } while( true );
        }
      }
LAB_0011a049:
      freeaddrinfo(local_40);
    }
    else {
      u->err = "host not found";
      free(puVar2);
    }
  }
  return -1;
}

Assistant:

ngx_int_t
ngx_inet_resolve_host(ngx_pool_t *pool, ngx_url_t *u)
{
    u_char               *p, *host;
    size_t                len;
    in_port_t             port;
    ngx_uint_t            i;
    struct addrinfo       hints, *res, *rp;
    struct sockaddr_in   *sin;
    struct sockaddr_in6  *sin6;

    port = htons(u->port);

    host = ngx_alloc(u->host.len + 1, pool->log);
    if (host == NULL) {
        return NGX_ERROR;
    }

    (void) ngx_cpystrn(host, u->host.data, u->host.len + 1);

    ngx_memzero(&hints, sizeof(struct addrinfo));
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;
#ifdef AI_ADDRCONFIG
    hints.ai_flags = AI_ADDRCONFIG;
#endif

    if (getaddrinfo((char *) host, NULL, &hints, &res) != 0) {
        u->err = "host not found";
        ngx_free(host);
        return NGX_ERROR;
    }

    ngx_free(host);

    for (i = 0, rp = res; rp != NULL; rp = rp->ai_next) {

        switch (rp->ai_family) {

        case AF_INET:
        case AF_INET6:
            break;

        default:
            continue;
        }

        i++;
    }

    if (i == 0) {
        u->err = "host not found";
        goto failed;
    }

    /* MP: ngx_shared_palloc() */

    u->addrs = ngx_pcalloc(pool, i * sizeof(ngx_addr_t));
    if (u->addrs == NULL) {
        goto failed;
    }

    u->naddrs = i;

    i = 0;

    /* AF_INET addresses first */

    for (rp = res; rp != NULL; rp = rp->ai_next) {

        if (rp->ai_family != AF_INET) {
            continue;
        }

        sin = ngx_pcalloc(pool, rp->ai_addrlen);
        if (sin == NULL) {
            goto failed;
        }

        ngx_memcpy(sin, rp->ai_addr, rp->ai_addrlen);

        sin->sin_port = port;

        u->addrs[i].sockaddr = (struct sockaddr *) sin;
        u->addrs[i].socklen = rp->ai_addrlen;

        len = NGX_INET_ADDRSTRLEN + sizeof(":65535") - 1;

        p = ngx_pnalloc(pool, len);
        if (p == NULL) {
            goto failed;
        }

        len = ngx_sock_ntop((struct sockaddr *) sin, rp->ai_addrlen, p, len, 1);

        u->addrs[i].name.len = len;
        u->addrs[i].name.data = p;

        i++;
    }

    for (rp = res; rp != NULL; rp = rp->ai_next) {

        if (rp->ai_family != AF_INET6) {
            continue;
        }

        sin6 = ngx_pcalloc(pool, rp->ai_addrlen);
        if (sin6 == NULL) {
            goto failed;
        }

        ngx_memcpy(sin6, rp->ai_addr, rp->ai_addrlen);

        sin6->sin6_port = port;

        u->addrs[i].sockaddr = (struct sockaddr *) sin6;
        u->addrs[i].socklen = rp->ai_addrlen;

        len = NGX_INET6_ADDRSTRLEN + sizeof("[]:65535") - 1;

        p = ngx_pnalloc(pool, len);
        if (p == NULL) {
            goto failed;
        }

        len = ngx_sock_ntop((struct sockaddr *) sin6, rp->ai_addrlen, p,
                            len, 1);

        u->addrs[i].name.len = len;
        u->addrs[i].name.data = p;

        i++;
    }

    freeaddrinfo(res);
    return NGX_OK;

failed:

    freeaddrinfo(res);
    return NGX_ERROR;
}